

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersector1<4,_1,_true,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMvIntersector1Pluecker<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  StackItemT<embree::NodeRefPtr<4>_> SVar5;
  StackItemT<embree::NodeRefPtr<4>_> SVar6;
  StackItemT<embree::NodeRefPtr<4>_> SVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined8 uVar11;
  Geometry *this;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  byte bVar16;
  bool bVar17;
  uint uVar18;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar19;
  long lVar20;
  byte bVar21;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar22;
  long lVar23;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar24;
  ulong uVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar37;
  float fVar38;
  float fVar42;
  float fVar43;
  undefined1 auVar39 [16];
  float fVar44;
  undefined1 auVar40 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar41;
  float fVar45;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar52;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar56;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  float fVar65;
  float fVar66;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  stack[0].ptr.ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack[0].ptr.ptr == 8) {
    return false;
  }
  stack[0].dist = 0;
  fVar1 = (query->p).field_0.field_0.x;
  fVar2 = (query->p).field_0.field_0.y;
  fVar3 = (query->p).field_0.field_0.z;
  fVar62 = (context->query_radius).field_0.m128[0];
  fVar65 = (context->query_radius).field_0.m128[1];
  fVar66 = (context->query_radius).field_0.m128[2];
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar64 = ZEXT416((uint)(query->radius * query->radius));
  }
  else {
    aVar4 = (context->query_radius).field_0;
    auVar64 = dpps((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
  }
  pSVar22 = stack + 1;
  bVar17 = false;
  do {
LAB_006951db:
    do {
      do {
        if (pSVar22 == stack) {
          return bVar17;
        }
        pSVar19 = pSVar22 + -1;
        pSVar22 = pSVar22 + -1;
      } while (auVar64._0_4_ < (float)pSVar19->dist);
      pSVar19 = stack;
      pSVar24 = (StackItemT<embree::NodeRefPtr<4>_> *)(pSVar22->ptr).ptr;
LAB_006951ff:
      if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
        if (((ulong)pSVar24 & 8) != 0) goto LAB_00695504;
        SVar37 = pSVar24[6];
        SVar41 = pSVar24[2];
        SVar56 = pSVar24[3];
        SVar5 = pSVar24[4];
        SVar6 = pSVar24[5];
        SVar7 = pSVar24[7];
        auVar55._4_4_ = fVar1;
        auVar55._0_4_ = fVar1;
        auVar55._8_4_ = fVar1;
        auVar55._12_4_ = fVar1;
        auVar39 = maxps(auVar55,(undefined1  [16])SVar41);
        auVar39 = minps(auVar39,(undefined1  [16])SVar56);
        fVar38 = auVar39._0_4_ - fVar1;
        fVar43 = auVar39._4_4_ - fVar1;
        fVar45 = auVar39._8_4_ - fVar1;
        fVar50 = auVar39._12_4_ - fVar1;
        auVar63._4_4_ = fVar2;
        auVar63._0_4_ = fVar2;
        auVar63._8_4_ = fVar2;
        auVar63._12_4_ = fVar2;
        auVar39 = maxps(auVar63,(undefined1  [16])SVar5);
        auVar39 = minps(auVar39,(undefined1  [16])SVar6);
        fVar52 = auVar39._0_4_ - fVar2;
        fVar57 = auVar39._4_4_ - fVar2;
        fVar58 = auVar39._8_4_ - fVar2;
        fVar59 = auVar39._12_4_ - fVar2;
        auVar61._4_4_ = fVar3;
        auVar61._0_4_ = fVar3;
        auVar61._8_4_ = fVar3;
        auVar61._12_4_ = fVar3;
        auVar39 = maxps(auVar61,(undefined1  [16])SVar37);
        auVar39 = minps(auVar39,(undefined1  [16])SVar7);
        fVar42 = auVar39._0_4_ - fVar3;
        fVar44 = auVar39._4_4_ - fVar3;
        fVar49 = auVar39._8_4_ - fVar3;
        fVar51 = auVar39._12_4_ - fVar3;
        tNear.field_0.v[0] = fVar42 * fVar42 + fVar52 * fVar52 + fVar38 * fVar38;
        tNear.field_0.v[1] = fVar44 * fVar44 + fVar57 * fVar57 + fVar43 * fVar43;
        tNear.field_0.v[2] = fVar49 * fVar49 + fVar58 * fVar58 + fVar45 * fVar45;
        tNear.field_0.v[3] = fVar51 * fVar51 + fVar59 * fVar59 + fVar50 * fVar50;
        bVar13 = (((float)SVar37.ptr.ptr <= fVar66 + fVar3 &&
                  fVar1 - fVar62 <= (float)SVar56.ptr.ptr) &&
                 ((float)SVar5.ptr.ptr <= fVar65 + fVar2 && (float)SVar41.ptr.ptr <= fVar1 + fVar62)
                 ) && (fVar3 - fVar66 <= (float)SVar7.ptr.ptr &&
                      (fVar2 - fVar65 <= (float)SVar6.ptr.ptr &&
                      (float)SVar41.ptr.ptr <= (float)SVar56.ptr.ptr));
        bVar14 = ((SVar37.ptr.ptr._4_4_ <= fVar66 + fVar3 && fVar1 - fVar62 <= SVar56.ptr.ptr._4_4_)
                 && (SVar5.ptr.ptr._4_4_ <= fVar65 + fVar2 && SVar41.ptr.ptr._4_4_ <= fVar1 + fVar62
                    )) && (fVar3 - fVar66 <= SVar7.ptr.ptr._4_4_ &&
                          (fVar2 - fVar65 <= SVar6.ptr.ptr._4_4_ &&
                          SVar41.ptr.ptr._4_4_ <= SVar56.ptr.ptr._4_4_));
        bVar12 = (((float)SVar37.dist <= fVar66 + fVar3 && fVar1 - fVar62 <= (float)SVar56.dist) &&
                 ((float)SVar5.dist <= fVar65 + fVar2 && (float)SVar41.dist <= fVar1 + fVar62)) &&
                 (fVar3 - fVar66 <= (float)SVar7.dist &&
                 (fVar2 - fVar65 <= (float)SVar6.dist && (float)SVar41.dist <= (float)SVar56.dist));
        bVar15 = ((SVar37._12_4_ <= fVar66 + fVar3 && fVar1 - fVar62 <= SVar56._12_4_) &&
                 (SVar5._12_4_ <= fVar65 + fVar2 && SVar41._12_4_ <= fVar1 + fVar62)) &&
                 (fVar3 - fVar66 <= SVar7._12_4_ &&
                 (fVar2 - fVar65 <= SVar6._12_4_ && SVar41._12_4_ <= SVar56._12_4_));
LAB_0069526f:
        auVar27._0_4_ = (uint)bVar13 * -0x80000000;
        auVar27._4_4_ = (uint)bVar14 * -0x80000000;
        auVar27._8_4_ = (uint)bVar12 * -0x80000000;
        auVar27._12_4_ = (uint)bVar15 * -0x80000000;
        uVar18 = movmskps((int)pSVar19,auVar27);
        if (uVar18 != 0) {
          uVar18 = uVar18 & 0xff;
          uVar25 = (ulong)pSVar24 & 0xfffffffffffffff0;
          lVar20 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
            }
          }
          pSVar19 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar25 + lVar20 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          pSVar24 = pSVar19;
          if (uVar18 != 0) {
            uVar8 = tNear.field_0.i[lVar20];
            lVar20 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
              }
            }
            pSVar24 = *(StackItemT<embree::NodeRefPtr<4>_> **)(uVar25 + lVar20 * 8);
            uVar9 = tNear.field_0.i[lVar20];
            uVar18 = uVar18 - 1 & uVar18;
            if (uVar18 == 0) {
              if (uVar8 < uVar9) {
                (pSVar22->ptr).ptr = (size_t)pSVar24;
                pSVar22->dist = uVar9;
                pSVar22 = pSVar22 + 1;
                pSVar24 = pSVar19;
              }
              else {
                (pSVar22->ptr).ptr = (size_t)pSVar19;
                pSVar22->dist = uVar8;
                pSVar19 = pSVar24;
                pSVar22 = pSVar22 + 1;
              }
            }
            else {
              auVar36._8_4_ = uVar8;
              auVar36._0_8_ = pSVar19;
              auVar36._12_4_ = 0;
              auVar46._8_4_ = uVar9;
              auVar46._0_8_ = pSVar24;
              auVar46._12_4_ = 0;
              lVar20 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                }
              }
              uVar11 = *(undefined8 *)(uVar25 + lVar20 * 8);
              iVar10 = tNear.field_0.i[lVar20];
              auVar40._8_4_ = iVar10;
              auVar40._0_8_ = uVar11;
              auVar40._12_4_ = 0;
              auVar28._8_4_ = -(uint)((int)uVar8 < (int)uVar9);
              uVar18 = uVar18 - 1 & uVar18;
              if (uVar18 == 0) {
                auVar28._4_4_ = auVar28._8_4_;
                auVar28._0_4_ = auVar28._8_4_;
                auVar28._12_4_ = auVar28._8_4_;
                auVar53._8_4_ = uVar9;
                auVar53._0_8_ = pSVar24;
                auVar53._12_4_ = 0;
                auVar54 = blendvps(auVar53,auVar36,auVar28);
                auVar39 = blendvps(auVar36,auVar46,auVar28);
                auVar29._8_4_ = -(uint)(auVar54._8_4_ < iVar10);
                auVar29._4_4_ = auVar29._8_4_;
                auVar29._0_4_ = auVar29._8_4_;
                auVar29._12_4_ = auVar29._8_4_;
                auVar47._8_4_ = iVar10;
                auVar47._0_8_ = uVar11;
                auVar47._12_4_ = 0;
                auVar48 = blendvps(auVar47,auVar54,auVar29);
                auVar54 = blendvps(auVar54,auVar40,auVar29);
                auVar30._8_4_ = -(uint)(auVar39._8_4_ < auVar54._8_4_);
                auVar30._4_4_ = auVar30._8_4_;
                auVar30._0_4_ = auVar30._8_4_;
                auVar30._12_4_ = auVar30._8_4_;
                SVar41 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar54,auVar39,auVar30);
                SVar37 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar39,auVar54,auVar30);
                *pSVar22 = SVar37;
                pSVar22[1] = SVar41;
                pSVar19 = auVar48._0_8_;
                pSVar22 = pSVar22 + 2;
                pSVar24 = pSVar19;
              }
              else {
                lVar20 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                  }
                }
                auVar31._4_4_ = auVar28._8_4_;
                auVar31._0_4_ = auVar28._8_4_;
                auVar31._8_4_ = auVar28._8_4_;
                auVar31._12_4_ = auVar28._8_4_;
                auVar55 = blendvps(auVar46,auVar36,auVar31);
                auVar39 = blendvps(auVar36,auVar46,auVar31);
                auVar60._8_4_ = tNear.field_0.i[lVar20];
                auVar60._0_8_ = *(undefined8 *)(uVar25 + lVar20 * 8);
                auVar60._12_4_ = 0;
                auVar32._8_4_ = -(uint)(iVar10 < tNear.field_0.i[lVar20]);
                auVar32._4_4_ = auVar32._8_4_;
                auVar32._0_4_ = auVar32._8_4_;
                auVar32._12_4_ = auVar32._8_4_;
                auVar54 = blendvps(auVar60,auVar40,auVar32);
                auVar48 = blendvps(auVar40,auVar60,auVar32);
                auVar33._8_4_ = -(uint)(auVar39._8_4_ < auVar48._8_4_);
                auVar33._4_4_ = auVar33._8_4_;
                auVar33._0_4_ = auVar33._8_4_;
                auVar33._12_4_ = auVar33._8_4_;
                auVar61 = blendvps(auVar48,auVar39,auVar33);
                SVar37 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar39,auVar48,auVar33);
                auVar34._8_4_ = -(uint)(auVar55._8_4_ < auVar54._8_4_);
                auVar34._4_4_ = auVar34._8_4_;
                auVar34._0_4_ = auVar34._8_4_;
                auVar34._12_4_ = auVar34._8_4_;
                auVar39 = blendvps(auVar54,auVar55,auVar34);
                auVar48 = blendvps(auVar55,auVar54,auVar34);
                auVar35._8_4_ = -(uint)(auVar48._8_4_ < auVar61._8_4_);
                auVar35._4_4_ = auVar35._8_4_;
                auVar35._0_4_ = auVar35._8_4_;
                auVar35._12_4_ = auVar35._8_4_;
                SVar41 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar61,auVar48,auVar35);
                SVar56 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar48,auVar61,auVar35);
                *pSVar22 = SVar37;
                pSVar22[1] = SVar56;
                pSVar22[2] = SVar41;
                pSVar19 = auVar39._0_8_;
                pSVar22 = pSVar22 + 3;
                pSVar24 = pSVar19;
              }
            }
          }
          goto LAB_006951ff;
        }
        goto LAB_006951db;
      }
      if (((ulong)pSVar24 & 8) == 0) {
        SVar37 = pSVar24[2];
        SVar41 = pSVar24[3];
        auVar39._4_4_ = fVar1;
        auVar39._0_4_ = fVar1;
        auVar39._8_4_ = fVar1;
        auVar39._12_4_ = fVar1;
        auVar39 = maxps(auVar39,(undefined1  [16])SVar37);
        auVar39 = minps(auVar39,(undefined1  [16])SVar41);
        fVar38 = auVar39._0_4_ - fVar1;
        fVar42 = auVar39._4_4_ - fVar1;
        fVar43 = auVar39._8_4_ - fVar1;
        fVar44 = auVar39._12_4_ - fVar1;
        auVar48._4_4_ = fVar2;
        auVar48._0_4_ = fVar2;
        auVar48._8_4_ = fVar2;
        auVar48._12_4_ = fVar2;
        auVar39 = maxps(auVar48,(undefined1  [16])pSVar24[4]);
        auVar39 = minps(auVar39,(undefined1  [16])pSVar24[5]);
        fVar45 = auVar39._0_4_ - fVar2;
        fVar49 = auVar39._4_4_ - fVar2;
        fVar50 = auVar39._8_4_ - fVar2;
        fVar51 = auVar39._12_4_ - fVar2;
        auVar54._4_4_ = fVar3;
        auVar54._0_4_ = fVar3;
        auVar54._8_4_ = fVar3;
        auVar54._12_4_ = fVar3;
        auVar39 = maxps(auVar54,(undefined1  [16])pSVar24[6]);
        auVar39 = minps(auVar39,(undefined1  [16])pSVar24[7]);
        fVar52 = auVar39._0_4_ - fVar3;
        fVar57 = auVar39._4_4_ - fVar3;
        fVar58 = auVar39._8_4_ - fVar3;
        fVar59 = auVar39._12_4_ - fVar3;
        tNear.field_0.v[0] = fVar52 * fVar52 + fVar45 * fVar45 + fVar38 * fVar38;
        tNear.field_0.v[1] = fVar57 * fVar57 + fVar49 * fVar49 + fVar42 * fVar42;
        tNear.field_0.v[2] = fVar58 * fVar58 + fVar50 * fVar50 + fVar43 * fVar43;
        tNear.field_0.v[3] = fVar59 * fVar59 + fVar51 * fVar51 + fVar44 * fVar44;
        bVar13 = (float)SVar37.ptr.ptr <= (float)SVar41.ptr.ptr &&
                 tNear.field_0.v[0] <= fVar62 * fVar62;
        bVar14 = SVar37.ptr.ptr._4_4_ <= SVar41.ptr.ptr._4_4_ &&
                 tNear.field_0.v[1] <= fVar62 * fVar62;
        bVar12 = (float)SVar37.dist <= (float)SVar41.dist && tNear.field_0.v[2] <= fVar62 * fVar62;
        bVar15 = SVar37._12_4_ <= SVar41._12_4_ && tNear.field_0.v[3] <= fVar62 * fVar62;
        goto LAB_0069526f;
      }
LAB_00695504:
      lVar26 = ((ulong)pSVar24 & 0xfffffffffffffff0) + 0xd0;
      bVar16 = 0;
      for (lVar20 = 0; lVar20 != (ulong)((uint)pSVar24 & 0xf) - 8; lVar20 = lVar20 + 1) {
        bVar21 = 0;
        for (lVar23 = -0x10; lVar23 != 0; lVar23 = lVar23 + 4) {
          uVar18 = *(uint *)(lVar26 + lVar23);
          if ((ulong)uVar18 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar18].ptr;
          context->geomID = uVar18;
          context->primID = *(uint *)(lVar26 + 0x10 + lVar23);
          bVar15 = Geometry::pointQuery(this,query,context);
          bVar21 = bVar21 | bVar15;
        }
        bVar16 = bVar16 | bVar21;
        lVar26 = lVar26 + 0xe0;
      }
    } while (bVar16 == 0);
    auVar64 = *(undefined1 (*) [16])(context->query_radius).field_0.m128;
    fVar62 = auVar64._0_4_;
    fVar65 = auVar64._4_4_;
    fVar66 = auVar64._8_4_;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar64 = ZEXT416((uint)(query->radius * query->radius));
    }
    else {
      auVar64 = dpps(auVar64,auVar64,0x7f);
    }
    bVar17 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }